

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode doh_run_probe(Curl_easy *data,doh_probe *p,DNStype dnstype,char *host,char *url,
                      CURLM *multi,curl_slist *headers)

{
  DOHcode DVar1;
  CURLMcode CVar2;
  timediff_t tVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  long mask;
  DOHcode d;
  timediff_t timeout_ms;
  Curl_easy *pCStack_48;
  CURLcode result;
  Curl_easy *doh;
  CURLM *multi_local;
  char *url_local;
  char *host_local;
  doh_probe *pdStack_20;
  DNStype dnstype_local;
  doh_probe *p_local;
  Curl_easy *data_local;
  
  pCStack_48 = (Curl_easy *)0x0;
  doh = (Curl_easy *)multi;
  multi_local = (CURLM *)url;
  url_local = host;
  host_local._4_4_ = dnstype;
  pdStack_20 = p;
  p_local = (doh_probe *)data;
  DVar1 = doh_req_encode(host,dnstype,p->req_body,0x200,&p->req_body_len);
  if (DVar1 == DOH_OK) {
    pdStack_20->dnstype = host_local._4_4_;
    Curl_dyn_init(&pdStack_20->resp_body,3000);
    tVar3 = Curl_timeleft((Curl_easy *)p_local,(curltime *)0x0,true);
    if (tVar3 < 1) {
      timeout_ms._4_4_ = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      timeout_ms._4_4_ = Curl_open(&stack0xffffffffffffffb8);
      if (timeout_ms._4_4_ == CURLE_OK) {
        *(uint *)&(pCStack_48->state).field_0x744 =
             *(uint *)&(pCStack_48->state).field_0x744 & 0xfffbffff | 0x40000;
        (pCStack_48->state).feat = &Curl_doh_trc;
        timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_URL,multi_local);
        if ((((((((timeout_ms._4_4_ == CURLE_OK) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
               (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_DEFAULT_PROTOCOL,"https"),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
              ((((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_WRITEFUNCTION,doh_write_cb)
                 , timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
               (((timeout_ms._4_4_ =
                       curl_easy_setopt(pCStack_48,CURLOPT_WRITEDATA,&pdStack_20->resp_body),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
             (((timeout_ms._4_4_ =
                     curl_easy_setopt(pCStack_48,CURLOPT_POSTFIELDS,pdStack_20->req_body),
               timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
              (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
            (((((timeout_ms._4_4_ =
                      curl_easy_setopt(pCStack_48,CURLOPT_POSTFIELDSIZE,pdStack_20->req_body_len),
                timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
              (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_HTTPHEADER,headers),
                timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
             (((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_PROTOCOLS,2),
               timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
              (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
           (((((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_TIMEOUT_MS,tVar3),
               timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
              (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
             (((((timeout_ms._4_4_ =
                       curl_easy_setopt(pCStack_48,CURLOPT_SHARE,
                                        *(undefined8 *)(p_local->req_body + 0xd4)),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
               (((*(long *)(p_local->req_body + 0x1c4) == 0 ||
                 (*(long *)(p_local->req_body + 0x1c4) == _stderr)) ||
                ((timeout_ms._4_4_ =
                       curl_easy_setopt(pCStack_48,CURLOPT_STDERR,
                                        *(undefined8 *)(p_local->req_body + 0x1c4)),
                 timeout_ms._4_4_ == CURLE_OK ||
                 ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))) &&
              ((p_local == (doh_probe *)0x0 ||
               (((*(ulong *)(p_local[4].req_body + 0x1ae) >> 0x1c & 1) == 0 ||
                (((((*(long *)(p_local[8].req_body + 0x154) != 0 &&
                    (*(int *)(*(long *)(p_local[8].req_body + 0x154) + 8) < 1)) ||
                   (Curl_doh_trc.log_level < 1)) ||
                  ((timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_VERBOSE,1),
                   timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)))) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))))) &&
            ((((*(ulong *)(p_local[4].req_body + 0x1ae) >> 0x1f & 1) == 0 ||
              (timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_NOSIGNAL,1),
              timeout_ms._4_4_ == CURLE_OK)) ||
             ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN || (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION))
             )))))) {
          uVar9 = 0;
          if (((uint)((ulong)*(undefined8 *)(p_local[4].req_body + 0x1ae) >> 0x32) & 1) != 0) {
            uVar9 = 2;
          }
          timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_SSL_VERIFYHOST,uVar9);
          if ((((((((((timeout_ms._4_4_ == CURLE_OK) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                    (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                   (((timeout_ms._4_4_ =
                           curl_easy_setopt(pCStack_48,CURLOPT_SSL_VERIFYPEER,
                                            (ulong)(((uint)((ulong)*(undefined8 *)
                                                                    (p_local[4].req_body + 0x1ae) >>
                                                           0x31) & 1) != 0)),
                     timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                    (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                  (((timeout_ms._4_4_ =
                          curl_easy_setopt(pCStack_48,CURLOPT_SSL_VERIFYSTATUS,
                                           (ulong)(((uint)((ulong)*(undefined8 *)
                                                                   (p_local[4].req_body + 0x1ae) >>
                                                          0x33) & 1) != 0)),
                    timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                   (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                 ((((((p_local[2].req_body[0x18c] >> 1 & 1) == 0 ||
                     (timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_SSL_FALSESTART,1),
                     timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                   (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                  (((*(long *)(p_local[3].req_body + 0xcc) == 0 ||
                    (timeout_ms._4_4_ =
                          curl_easy_setopt(pCStack_48,CURLOPT_CAINFO,
                                           *(undefined8 *)(p_local[3].req_body + 0xcc)),
                    timeout_ms._4_4_ == CURLE_OK)) ||
                   ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                    (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))) &&
                ((((*(long *)(p_local[4].req_body + 0xcc) == 0 ||
                   (timeout_ms._4_4_ =
                         curl_easy_setopt(pCStack_48,CURLOPT_CAINFO_BLOB,
                                          *(undefined8 *)(p_local[4].req_body + 0xcc)),
                   timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
               ((((*(long *)(p_local[3].req_body + 0xc4) == 0 ||
                  (timeout_ms._4_4_ =
                        curl_easy_setopt(pCStack_48,CURLOPT_CAPATH,
                                         *(undefined8 *)(p_local[3].req_body + 0xc4)),
                  timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
              (((*(long *)(p_local[3].req_body + 0xec) == 0 ||
                (timeout_ms._4_4_ =
                      curl_easy_setopt(pCStack_48,CURLOPT_CRLFILE,
                                       *(undefined8 *)(p_local[3].req_body + 0xec)),
                timeout_ms._4_4_ == CURLE_OK)) ||
               ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
             (((((((p_local[2].req_body[0x18c] & 1) == 0 ||
                  (timeout_ms._4_4_ = curl_easy_setopt(pCStack_48,CURLOPT_CERTINFO,1),
                  timeout_ms._4_4_ == CURLE_OK)) ||
                 ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                (((((*(long *)(p_local[2].req_body + 0x154) == 0 ||
                    (timeout_ms._4_4_ =
                          curl_easy_setopt(pCStack_48,CURLOPT_SSL_CTX_FUNCTION,
                                           *(undefined8 *)(p_local[2].req_body + 0x154)),
                    timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                 (((*(long *)(p_local[2].req_body + 0x15c) == 0 ||
                   (timeout_ms._4_4_ =
                         curl_easy_setopt(pCStack_48,CURLOPT_SSL_CTX_DATA,
                                          *(undefined8 *)(p_local[2].req_body + 0x15c)),
                   timeout_ms._4_4_ == CURLE_OK)) ||
                  ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                   (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))) &&
               (((*(long *)(p_local[1].req_body + 0x2c) == 0 ||
                 (timeout_ms._4_4_ =
                       curl_easy_setopt(pCStack_48,CURLOPT_DEBUGFUNCTION,
                                        *(undefined8 *)(p_local[1].req_body + 0x2c)),
                 timeout_ms._4_4_ == CURLE_OK)) ||
                ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
              (((((*(long *)(p_local->req_body + 0x1cc) == 0 ||
                  (timeout_ms._4_4_ =
                        curl_easy_setopt(pCStack_48,CURLOPT_DEBUGDATA,
                                         *(undefined8 *)(p_local->req_body + 0x1cc)),
                  timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
               (((*(long *)(p_local[4].req_body + 0x7c) == 0 ||
                 (timeout_ms._4_4_ =
                       curl_easy_setopt(pCStack_48,CURLOPT_SSL_EC_CURVES,
                                        *(undefined8 *)(p_local[4].req_body + 0x7c)),
                 timeout_ms._4_4_ == CURLE_OK)) ||
                ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))))) {
            uVar4 = 0;
            if ((p_local[2].req_body[0x18c] >> 3 & 1) != 0) {
              uVar4 = 2;
            }
            uVar5 = 0;
            if ((p_local[2].req_body[0x18c] >> 4 & 1) != 0) {
              uVar5 = 4;
            }
            uVar6 = 0;
            if ((p_local[2].req_body[0x18c] >> 5 & 1) != 0) {
              uVar6 = 8;
            }
            uVar7 = 0;
            if ((p_local[2].req_body[0x18c] >> 6 & 1) != 0) {
              uVar7 = 0x10;
            }
            uVar8 = 0;
            if ((char)p_local[2].req_body[0x18c] < '\0') {
              uVar8 = 0x20;
            }
            curl_easy_setopt(pCStack_48,CURLOPT_SSL_OPTIONS,
                             (long)(int)((p_local[2].req_body[0x18c] >> 2 & 1) != 0 | uVar4 | uVar5
                                         | uVar6 | uVar7 | uVar8));
            (pCStack_48->set).fmultidone = doh_done;
            (pCStack_48->set).dohfor_mid = *(curl_off_t *)(p_local->req_body + 4);
            CVar2 = curl_multi_add_handle((Curl_multi *)doh,pCStack_48);
            if (CVar2 == CURLM_OK) {
              pdStack_20->easy_mid = pCStack_48->mid;
              return CURLE_OK;
            }
          }
        }
      }
    }
    Curl_close(&stack0xffffffffffffffb8);
    pdStack_20->easy_mid = -1;
    data_local._4_4_ = timeout_ms._4_4_;
  }
  else {
    Curl_failf((Curl_easy *)p_local,"Failed to encode DoH packet [%d]",(ulong)DVar1);
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode doh_run_probe(struct Curl_easy *data,
                              struct doh_probe *p, DNStype dnstype,
                              const char *host,
                              const char *url, CURLM *multi,
                              struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_req_encode(host, dnstype, p->req_body, sizeof(p->req_body),
                             &p->req_body_len);
  if(d) {
    failf(data, "Failed to encode DoH packet [%d]", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  Curl_dyn_init(&p->resp_body, DYN_DOH_RESPONSE);

  timeout_ms = Curl_timeleft(data, NULL, TRUE);
  if(timeout_ms <= 0) {
    result = CURLE_OPERATION_TIMEDOUT;
    goto error;
  }
  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(result)
    goto error;

  /* pass in the struct pointer via a local variable to please coverity and
     the gcc typecheck helpers */
  doh->state.internal = true;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  doh->state.feat = &Curl_doh_trc;
#endif
  ERROR_CHECK_SETOPT(CURLOPT_URL, url);
  ERROR_CHECK_SETOPT(CURLOPT_DEFAULT_PROTOCOL, "https");
  ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
  ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, &p->resp_body);
  ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->req_body);
  ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->req_body_len);
  ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_HTTP2
  ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
  ERROR_CHECK_SETOPT(CURLOPT_PIPEWAIT, 1L);
#endif
#ifndef DEBUGBUILD
  /* enforce HTTPS if not debug */
  ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#else
  /* in debug mode, also allow http */
  ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTP|CURLPROTO_HTTPS);
#endif
  ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
  ERROR_CHECK_SETOPT(CURLOPT_SHARE, data->share);
  if(data->set.err && data->set.err != stderr)
    ERROR_CHECK_SETOPT(CURLOPT_STDERR, data->set.err);
  if(Curl_trc_ft_is_verbose(data, &Curl_doh_trc))
    ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
  if(data->set.no_signal)
    ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST,
    data->set.doh_verifyhost ? 2L : 0L);
  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER,
    data->set.doh_verifypeer ? 1L : 0L);
  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS,
    data->set.doh_verifystatus ? 1L : 0L);

  /* Inherit *some* SSL options from the user's transfer. This is a
     best-guess as to which options are needed for compatibility. #3661

     Note DoH does not inherit the user's proxy server so proxy SSL settings
     have no effect and are not inherited. If that changes then two new
     options should be added to check doh proxy insecure separately,
     CURLOPT_DOH_PROXY_SSL_VERIFYHOST and CURLOPT_DOH_PROXY_SSL_VERIFYPEER.
     */
  if(data->set.ssl.falsestart)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
  if(data->set.str[STRING_SSL_CAFILE]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
                       data->set.str[STRING_SSL_CAFILE]);
  }
  if(data->set.blobs[BLOB_CAINFO]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAINFO_BLOB,
                       data->set.blobs[BLOB_CAINFO]);
  }
  if(data->set.str[STRING_SSL_CAPATH]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
                       data->set.str[STRING_SSL_CAPATH]);
  }
  if(data->set.str[STRING_SSL_CRLFILE]) {
    ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
                       data->set.str[STRING_SSL_CRLFILE]);
  }
  if(data->set.ssl.certinfo)
    ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
  if(data->set.ssl.fsslctx)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
  if(data->set.ssl.fsslctxp)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);
  if(data->set.fdebug)
    ERROR_CHECK_SETOPT(CURLOPT_DEBUGFUNCTION, data->set.fdebug);
  if(data->set.debugdata)
    ERROR_CHECK_SETOPT(CURLOPT_DEBUGDATA, data->set.debugdata);
  if(data->set.str[STRING_SSL_EC_CURVES]) {
    ERROR_CHECK_SETOPT(CURLOPT_SSL_EC_CURVES,
                       data->set.str[STRING_SSL_EC_CURVES]);
  }

  {
    long mask =
      (data->set.ssl.enable_beast ?
       CURLSSLOPT_ALLOW_BEAST : 0) |
      (data->set.ssl.no_revoke ?
       CURLSSLOPT_NO_REVOKE : 0) |
      (data->set.ssl.no_partialchain ?
       CURLSSLOPT_NO_PARTIALCHAIN : 0) |
      (data->set.ssl.revoke_best_effort ?
       CURLSSLOPT_REVOKE_BEST_EFFORT : 0) |
      (data->set.ssl.native_ca_store ?
       CURLSSLOPT_NATIVE_CA : 0) |
      (data->set.ssl.auto_client_cert ?
       CURLSSLOPT_AUTO_CLIENT_CERT : 0);

    (void)curl_easy_setopt(doh, CURLOPT_SSL_OPTIONS, mask);
  }

  doh->set.fmultidone = doh_done;
  doh->set.dohfor_mid = data->mid; /* for which transfer this is done */

  /* DoH handles must not inherit private_data. The handles may be passed to
     the user via callbacks and the user will be able to identify them as
     internal handles because private data is not set. The user can then set
     private_data via CURLOPT_PRIVATE if they so choose. */
  DEBUGASSERT(!doh->set.private_data);

  if(curl_multi_add_handle(multi, doh))
    goto error;

  p->easy_mid = doh->mid;
  return CURLE_OK;

error:
  Curl_close(&doh);
  p->easy_mid = -1;
  return result;
}